

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

void Js::JavascriptOperators::SetAttributes
               (RecyclableObject *object,PropertyId propId,PropertyDescriptor *descriptor,bool force
               )

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint local_4c;
  uint local_3c;
  uint local_2c;
  uint local_28;
  BOOL isWritable;
  bool force_local;
  PropertyDescriptor *descriptor_local;
  PropertyId propId_local;
  RecyclableObject *object_local;
  
  if (object == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2666,"(object)","object");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = PropertyDescriptor::IsDataDescriptor(descriptor);
  if (bVar2) {
    bVar2 = PropertyDescriptor::WritableSpecified(descriptor);
    if (bVar2) {
      bVar2 = PropertyDescriptor::IsWritable(descriptor);
      local_2c = (uint)bVar2;
    }
    else {
      local_2c = 0;
    }
    local_28 = local_2c;
  }
  else {
    bVar2 = PropertyDescriptor::IsAccessorDescriptor(descriptor);
    local_28 = (uint)bVar2;
  }
  if ((force) || (bVar2 = PropertyDescriptor::ConfigurableSpecified(descriptor), bVar2)) {
    bVar2 = PropertyDescriptor::ConfigurableSpecified(descriptor);
    if (bVar2) {
      bVar2 = PropertyDescriptor::IsConfigurable(descriptor);
      local_3c = (uint)bVar2;
    }
    else {
      local_3c = 0;
    }
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3c])(object,(ulong)(uint)propId,(ulong)local_3c);
  }
  if ((force) || (bVar2 = PropertyDescriptor::EnumerableSpecified(descriptor), bVar2)) {
    bVar2 = PropertyDescriptor::EnumerableSpecified(descriptor);
    if (bVar2) {
      bVar2 = PropertyDescriptor::IsEnumerable(descriptor);
      local_4c = (uint)bVar2;
    }
    else {
      local_4c = 0;
    }
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3d])(object,(ulong)(uint)propId,(ulong)local_4c);
  }
  if (((force) || (bVar2 = PropertyDescriptor::WritableSpecified(descriptor), bVar2)) ||
     (local_28 != 0)) {
    (*(object->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
      [0x3b])(object,(ulong)(uint)propId,(ulong)local_28);
  }
  return;
}

Assistant:

void JavascriptOperators::SetAttributes(RecyclableObject* object, PropertyId propId, const PropertyDescriptor& descriptor, bool force)
    {
        Assert(object);

        BOOL isWritable = FALSE;
        if (descriptor.IsDataDescriptor())
        {
            isWritable = descriptor.WritableSpecified() ? descriptor.IsWritable() : FALSE;
        }
        else if (descriptor.IsAccessorDescriptor())
        {
            // The reason is that JavascriptOperators::OP_SetProperty checks for VarTo<RecyclableObject>(instance)->IsWritableOrAccessor(propertyId),
            // which should in fact check for 'is writable or accessor' but since there is no GetAttributes, we can't do that efficiently.
            isWritable = TRUE;
        }

        // CONSIDER: call object->SetAttributes which is much more efficient as that's 1 call instead of 3.
        //       Can't do that now as object->SetAttributes doesn't provide a way which attributes to modify and which not.
        if (force || descriptor.ConfigurableSpecified())
        {
            object->SetConfigurable(propId, descriptor.ConfigurableSpecified() ? descriptor.IsConfigurable() : FALSE);
        }
        if (force || descriptor.EnumerableSpecified())
        {
            object->SetEnumerable(propId, descriptor.EnumerableSpecified() ? descriptor.IsEnumerable() : FALSE);
        }
        if (force || descriptor.WritableSpecified() || isWritable)
        {
            object->SetWritable(propId, isWritable);
        }
    }